

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

bool __thiscall flow::lang::Lexer::continueParseRegEx(Lexer *this,char delim)

{
  int iVar1;
  bool bVar2;
  Token TVar3;
  int iVar4;
  undefined7 in_register_00000031;
  int iVar5;
  
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  iVar5 = -1;
  while( true ) {
    bVar2 = eof(this);
    iVar1 = this->currentChar_;
    iVar4 = (int)CONCAT71(in_register_00000031,delim);
    if ((bVar2) || (iVar5 != 0x5c && iVar1 == iVar4)) break;
    std::__cxx11::string::push_back((char)this + -0x58);
    iVar5 = this->currentChar_;
    nextChar(this,true);
  }
  TVar3 = Unknown;
  if (iVar1 == iVar4) {
    nextChar(this,true);
    TVar3 = RegExp;
  }
  this->token_ = TVar3;
  return iVar1 == iVar4;
}

Assistant:

bool Lexer::continueParseRegEx(char delim) {
  int last = -1;

  stringValue_.clear();

  while (!eof() && (currentChar() != delim || (last == '\\'))) {
    stringValue_ += static_cast<char>(currentChar());
    last = currentChar();
    nextChar();
  }

  if (currentChar() == delim) {
    nextChar();
    token_ = Token::RegExp;
    return true;
  }

  token_ = Token::Unknown;
  return false;
}